

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopBodyStart<(Js::LayoutSize)1,false>
          (InterpreterStackFrame *this,uint loopId)

{
  code *pcVar1;
  byte *pbVar2;
  
  if (((byte)this[0xd6] & 0x10) != 0) {
    *(int *)(this + 0xd0) = *(int *)(this + 0xd0) + 1;
  }
  pcVar1 = *(code **)(this + 0xe8);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)(this + *(long *)(this + 0xf0)) + -1);
  }
  (*pcVar1)(this + *(long *)(this + 0xf0),loopId,1,0);
  pbVar2 = ByteCodeReader::GetIP((ByteCodeReader *)this);
  return pbVar2;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopBodyStart(uint loopId)
    {
        if (profiled || isAutoProfiling)
        {
            this->currentLoopCounter++;
        }

        if (profiled)
        {
            OP_RecordImplicitCall(loopId);
        }

        (this->*(profiled ? opProfiledLoopBodyStart : opLoopBodyStart))(loopId, layoutSize, false /* isFirstIteration */);
        return m_reader.GetIP();
    }